

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O2

MutexFactory * MutexFactory::i(void)

{
  pointer __old_p;
  
  if ((__uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>)
      instance._M_t.super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
      super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
      super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>)0x0) {
    instance._M_t.super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
    super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
    super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl =
         (__uniq_ptr_data<MutexFactory,_std::default_delete<MutexFactory>,_true,_true>)
         operator_new(0x30);
    *(undefined ***)
     instance._M_t.super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
     super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
     super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl = &PTR__MutexFactory_0019c008;
    *(code **)((long)instance._M_t.
                     super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
                     super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
                     super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl + 8) = OSCreateMutex;
    *(code **)((long)instance._M_t.
                     super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
                     super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
                     super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl + 0x10) =
         OSDestroyMutex;
    *(code **)((long)instance._M_t.
                     super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
                     super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
                     super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl + 0x18) = OSLockMutex
    ;
    *(code **)((long)instance._M_t.
                     super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
                     super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
                     super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl + 0x20) =
         OSUnlockMutex;
    *(undefined1 *)
     ((long)instance._M_t.super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>.
            _M_t.super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
            super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl + 0x28) = 1;
  }
  return (MutexFactory *)
         instance._M_t.super___uniq_ptr_impl<MutexFactory,_std::default_delete<MutexFactory>_>._M_t.
         super__Tuple_impl<0UL,_MutexFactory_*,_std::default_delete<MutexFactory>_>.
         super__Head_base<0UL,_MutexFactory_*,_false>._M_head_impl;
}

Assistant:

CK_RV MutexFactory::DestroyMutex(CK_VOID_PTR mutex)
{
	if (!enabled) return CKR_OK;

	return (this->destroyMutex)(mutex);
}